

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O3

type llvm::make_unique<(anonymous_namespace)::SwiftCompilerTool,llvm::StringRef&>(StringRef *args)

{
  char *pcVar1;
  long in_RSI;
  
  pcVar1 = (char *)operator_new(0x28);
  *(undefined ***)pcVar1 = &PTR__Tool_0020aed8;
  *(char **)(pcVar1 + 8) = pcVar1 + 0x18;
  if (in_RSI == 0) {
    pcVar1[0x10] = '\0';
    pcVar1[0x11] = '\0';
    pcVar1[0x12] = '\0';
    pcVar1[0x13] = '\0';
    pcVar1[0x14] = '\0';
    pcVar1[0x15] = '\0';
    pcVar1[0x16] = '\0';
    pcVar1[0x17] = '\0';
    pcVar1[0x18] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)(pcVar1 + 8));
  }
  *(undefined ***)pcVar1 = &PTR__Tool_0020b990;
  args->Data = pcVar1;
  return (__uniq_ptr_data<(anonymous_namespace)::SwiftCompilerTool,_std::default_delete<(anonymous_namespace)::SwiftCompilerTool>,_true,_true>
          )(_Tuple_impl<0UL,_(anonymous_namespace)::SwiftCompilerTool_*,_std::default_delete<(anonymous_namespace)::SwiftCompilerTool>_>
            )0x20b990;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}